

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IdentifierNameSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token_const&>
          (BumpAllocator *this,Token *args)

{
  Token identifier;
  IdentifierNameSyntax *pIVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pIVar1 = (IdentifierNameSyntax *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  identifier.info = in_RSI;
  identifier._0_8_ = in_RSI->location;
  slang::syntax::IdentifierNameSyntax::IdentifierNameSyntax
            ((IdentifierNameSyntax *)in_RSI->rawTextPtr,identifier);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }